

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O2

bool double_conversion::(anonymous_namespace)::ConsumeSubStringImpl<char_const*,char(*)(char)>
               (char **current,char *end,char *substring,_func_char_char *converter)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar5 = substring + 1;
  do {
    cVar1 = *pcVar5;
    pcVar4 = *current + 1;
    *current = pcVar4;
    if ((cVar1 == '\0') || (pcVar4 == end)) break;
    cVar3 = (*converter)(*pcVar4);
    cVar2 = *pcVar5;
    pcVar5 = pcVar5 + 1;
  } while (cVar3 == cVar2);
  return cVar1 == '\0';
}

Assistant:

static inline bool ConsumeSubStringImpl(Iterator* current,
                                        Iterator end,
                                        const char* substring,
                                        Converter converter) {
  DOUBLE_CONVERSION_ASSERT(converter(**current) == *substring);
  for (substring++; *substring != '\0'; substring++) {
    ++*current;
    if (*current == end || converter(**current) != *substring) {
      return false;
    }
  }
  ++*current;
  return true;
}